

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

int Fl::has_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *t;
  Check *pCVar1;
  
  pCVar1 = first_check;
  while( true ) {
    if (pCVar1 == (Check *)0x0) {
      return 0;
    }
    if ((pCVar1->cb == cb) && (pCVar1->arg == argp)) break;
    pCVar1 = pCVar1->next;
  }
  return 1;
}

Assistant:

int Fl::has_check(Fl_Timeout_Handler cb, void *argp) {
  for (Check** p = &first_check; *p;) {
    Check* t = *p;
    if (t->cb == cb && t->arg == argp) {
      return 1;
    } else {
      p = &(t->next);
    }
  }
  return 0;
}